

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

aiReturn aiDetachLogStream(aiLogStream *stream)

{
  iterator __position;
  Logger *pLVar1;
  iterator iVar2;
  __pid_t __pid;
  
  __position = std::
               _Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
               ::find((_Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
                       *)Assimp::gActiveLogStreams,stream);
  if (__position._M_node != (_Base_ptr)(Assimp::gActiveLogStreams + 8)) {
    pLVar1 = Assimp::DefaultLogger::get();
    (*pLVar1->_vptr_Logger[3])(pLVar1,__position._M_node[1]._M_left,0xf);
    if (__position._M_node[1]._M_left != (_Base_ptr)0x0) {
      (**(code **)(*(long *)__position._M_node[1]._M_left + 8))();
    }
    __pid = 0x9c3de8;
    iVar2 = __position;
    std::
    _Rb_tree<aiLogStream,std::pair<aiLogStream_const,Assimp::LogStream*>,std::_Select1st<std::pair<aiLogStream_const,Assimp::LogStream*>>,Assimp::mpred,std::allocator<std::pair<aiLogStream_const,Assimp::LogStream*>>>
    ::erase_abi_cxx11_((_Rb_tree<aiLogStream,std::pair<aiLogStream_const,Assimp::LogStream*>,std::_Select1st<std::pair<aiLogStream_const,Assimp::LogStream*>>,Assimp::mpred,std::allocator<std::pair<aiLogStream_const,Assimp::LogStream*>>>
                        *)Assimp::gActiveLogStreams,__position);
    if (Assimp::gActiveLogStreams._40_8_ == 0) {
      Assimp::DefaultLogger::kill(__pid,(int)iVar2._M_node);
    }
  }
  return -(uint)(__position._M_node == (_Base_ptr)(Assimp::gActiveLogStreams + 8));
}

Assistant:

ASSIMP_API aiReturn aiDetachLogStream( const aiLogStream* stream)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();

#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
    // find the log-stream associated with this data
    LogStreamMap::iterator it = gActiveLogStreams.find( *stream);
    // it should be there... else the user is playing fools with us
    if( it == gActiveLogStreams.end())  {
        return AI_FAILURE;
    }
    DefaultLogger::get()->detatchStream( it->second );
    delete it->second;

    gActiveLogStreams.erase( it);

    if (gActiveLogStreams.empty()) {
        DefaultLogger::kill();
    }
    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}